

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O2

Vec_Int_t * Rnm_ManFilterSelected(Rnm_Man_t *p,Vec_Int_t *vOldPPis)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Gia_Obj_t *pObj;
  size_t sVar8;
  int iVar9;
  long lVar10;
  char *__assertion;
  size_t __nmemb;
  
  p->vFanins->nSize = 0;
  for (iVar9 = 0; iVar9 < vOldPPis->nSize; iVar9 = iVar9 + 1) {
    pGVar2 = p->pGia;
    iVar3 = Vec_IntEntry(vOldPPis,iVar9);
    pGVar5 = Gia_ManObj(pGVar2,iVar3);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    Ga2_ObjLeaves(p->pGia,pGVar5);
    for (iVar3 = 0; iVar3 < Ga2_ObjLeaves::v.nSize; iVar3 = iVar3 + 1) {
      pGVar2 = p->pGia;
      iVar4 = Vec_IntEntry(&Ga2_ObjLeaves::v,iVar3);
      pGVar5 = Gia_ManObj(pGVar2,iVar4);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      iVar4 = Rnm_ObjCount(p,pGVar5);
      if ((iVar4 < 0x10) && (Rnm_ObjSetCount(p,pGVar5,iVar4 + 1), iVar4 == 0)) {
        pVVar6 = p->vFanins;
        iVar4 = Gia_ObjId(p->pGia,pGVar5);
        Vec_IntPush(pVVar6,iVar4);
      }
    }
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  for (iVar9 = 0; iVar9 < vOldPPis->nSize; iVar9 = iVar9 + 1) {
    pGVar2 = p->pGia;
    iVar3 = Vec_IntEntry(vOldPPis,iVar9);
    pGVar5 = Gia_ManObj(pGVar2,iVar3);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pGVar5 & 0x9fffffff) != 0) ||
       (pGVar2 = p->pGia, iVar3 = Gia_ObjCioId(pGVar5), iVar3 < pGVar2->vCis->nSize - pGVar2->nRegs)
       ) {
      Ga2_ObjLeaves(p->pGia,pGVar5);
      iVar3 = 0;
      do {
        if (Ga2_ObjLeaves::v.nSize <= iVar3) goto LAB_00494088;
        pGVar2 = p->pGia;
        iVar4 = Vec_IntEntry(&Ga2_ObjLeaves::v,iVar3);
        pObj = Gia_ManObj(pGVar2,iVar4);
        if (pObj == (Gia_Obj_t *)0x0) goto LAB_00494088;
        if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) break;
        uVar1 = pObj->Value;
        if ((ulong)uVar1 != 0) {
          if (p->nObjsFrame <= (int)uVar1) {
            __assertion = "(int)pObj->Value < p->nObjsFrame";
            uVar1 = 0x60;
LAB_0049416b:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                          ,uVar1,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
          }
          if (p->pCex->iFrame < 0) {
            __assertion = "f >= 0 && f <= p->pCex->iFrame";
            uVar1 = 0x61;
            goto LAB_0049416b;
          }
          if (((uint)p->pObjs[uVar1] & 4) != 0) break;
        }
        iVar4 = Rnm_ObjCount(p,pObj);
        iVar3 = iVar3 + 1;
      } while (iVar4 < 2);
    }
    iVar3 = Gia_ObjId(p->pGia,pGVar5);
    Vec_IntPush(pVVar6,iVar3);
LAB_00494088:
  }
  iVar9 = pVVar6->nSize;
  __nmemb = (size_t)iVar9;
  if (1 < (long)__nmemb) {
    piVar7 = pVVar6->pArray;
    qsort(piVar7,__nmemb,4,Vec_IntSortCompare1);
    iVar3 = 1;
    for (sVar8 = 1; __nmemb != sVar8; sVar8 = sVar8 + 1) {
      if (piVar7[sVar8] != piVar7[sVar8 - 1]) {
        lVar10 = (long)iVar3;
        iVar3 = iVar3 + 1;
        piVar7[lVar10] = piVar7[sVar8];
      }
    }
    pVVar6->nSize = iVar3;
    if (iVar9 != iVar3) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRefSelect.c"
                    ,0xb2,"Vec_Int_t *Rnm_ManFilterSelected(Rnm_Man_t *, Vec_Int_t *)");
    }
  }
  iVar9 = 0;
  while( true ) {
    if (p->vFanins->nSize <= iVar9) {
      return pVVar6;
    }
    pGVar2 = p->pGia;
    iVar3 = Vec_IntEntry(p->vFanins,iVar9);
    pGVar5 = Gia_ManObj(pGVar2,iVar3);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    Rnm_ObjSetCount(p,pGVar5,0);
    iVar9 = iVar9 + 1;
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Rnm_ManFilterSelected( Rnm_Man_t * p, Vec_Int_t * vOldPPis )
{
    int fVerbose = 0;
    Vec_Int_t * vNewPPis, * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k, RetValue, Counters[3] = {0};

    // (0) make sure fanin counters are 0 at the beginning
//    Gia_ManForEachObj( p->pGia, pObj, i )
//        assert( Rnm_ObjCount(p, pObj) == 0 );

    // (1) increment PPI fanin counters
    Vec_IntClear( p->vFanins );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
            if ( Rnm_ObjAddToCount(p, pFanin) == 0 ) // fanin counter is 0 -- save it
                Vec_IntPush( p->vFanins, Gia_ObjId(p->pGia, pFanin) );
    }

    // (3) select objects with reconvergence, which create potential constraints
    // - flop objects
    // - objects whose fanin belongs to the justified area
    // - objects whose fanins overlap
    // (these do not guantee reconvergence, but may potentially have it)
    // (other objects cannot have reconvergence, even if they are added)
    vNewPPis = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vOldPPis, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            if ( fVerbose )
                Counters[0]++;
            Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
            continue;
        }
        vFanins = Ga2_ObjLeaves( p->pGia, pObj );
        Gia_ManForEachObjVec( vFanins, p->pGia, pFanin, k )
        {
            if ( Rnm_ObjIsJust(p, pFanin) || Rnm_ObjCount(p, pFanin) > 1 )
            {
                if ( fVerbose )
                    Counters[1] += Rnm_ObjIsJust(p, pFanin);
                if ( fVerbose )
                    Counters[2] += (Rnm_ObjCount(p, pFanin) > 1);
                Vec_IntPush( vNewPPis, Gia_ObjId(p->pGia, pObj) );
                break;
            }
        }
    }
    RetValue = Vec_IntUniqify( vNewPPis );
    assert( RetValue == 0 );

    // (4) clear fanin counters
    // this is important for counters to be correctly set in the future iterations -- see step (0)
    Gia_ManForEachObjVec( p->vFanins, p->pGia, pObj, i )
        Rnm_ObjSetCount( p, pObj, 0 );

    // visualize
    if ( fVerbose )
        printf( "*** Refinement %3d : PI+PPI =%4d. Old =%4d. New =%4d.   FF =%4d. Just =%4d. Shared =%4d.\n", 
            p->nRefId, Vec_IntSize(p->vMap), Vec_IntSize(vOldPPis), Vec_IntSize(vNewPPis), Counters[0], Counters[1], Counters[2] );

//    Rnm_ManPrintSelected( p, vNewPPis );
//    Ga2_StructAnalize( p->pGia, p->vMap, p->vObjs, vNewPPis );
    return vNewPPis;
}